

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_it_test.cpp
# Opt level: O0

void __thiscall license::test::volid_lic_file::test_method(volid_lic_file *this)

{
  unit_test_log_t *this_00;
  log_level lVar1;
  size_type sVar2;
  lazy_ostream *prev;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]> local_c0;
  basic_cstring<const_char> local_a0;
  begin local_90;
  unit_test_log_t local_72;
  allocator local_71;
  string local_70;
  FUNCTION_RETURN local_3c;
  undefined1 local_38 [4];
  FUNCTION_RETURN result_diskinfos;
  vector<DiskInfo,_std::allocator<DiskInfo>_> diskInfos;
  HwIdentifier identifier_out;
  volid_lic_file *this_local;
  
  hw_identifier::HwIdentifier::HwIdentifier
            ((HwIdentifier *)
             &diskInfos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<DiskInfo,_std::allocator<DiskInfo>_>::vector
            ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_38);
  local_3c = getDiskInfos((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_38);
  if ((local_3c == FUNC_RET_BUFFER_TOO_SMALL) || (local_3c == FUNC_RET_OK)) {
    sVar2 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::size
                      ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_38);
    if (sVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"volid_lic_file",&local_71);
      generate_and_verify_license(STRATEGY_DISK,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      goto LAB_00185d73;
    }
  }
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/hw_identifier_it_test.cpp"
             ,0x82);
  boost::unit_test::log::begin::begin(&local_90,&local_a0,0x39);
  lVar1 = boost::unit_test::unit_test_log_t::operator<<(this_00,&local_90);
  boost::unit_test::unit_test_log_t::operator()(&local_72,lVar1);
  prev = boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            (&local_c0,prev,(char (*) [56])"No disk found skipping testing disk hardware identifier"
            );
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_72,&local_c0.super_lazy_ostream);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]>
  ::~lazy_ostream_impl(&local_c0);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_72);
LAB_00185d73:
  std::vector<DiskInfo,_std::allocator<DiskInfo>_>::~vector
            ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_38);
  hw_identifier::HwIdentifier::~HwIdentifier
            ((HwIdentifier *)
             &diskInfos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(volid_lic_file) {
	HwIdentifier identifier_out;
	vector<DiskInfo> diskInfos;
	FUNCTION_RETURN result_diskinfos = getDiskInfos(diskInfos);
	if ((result_diskinfos == FUNC_RET_BUFFER_TOO_SMALL || result_diskinfos == FUNC_RET_OK) && diskInfos.size() > 0) {
		generate_and_verify_license(LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_DISK, "volid_lic_file");
	} else {
		BOOST_TEST_MESSAGE("No disk found skipping testing disk hardware identifier");
	}
}